

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void compare_ule(CPUMIPSState_conflict10 *env,wr_t *pwd,wr_t *pws,wr_t *pwt,uint32_t df,int quiet,
                uintptr_t retaddr)

{
  int32_t *piVar1;
  float_status *pfVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float32 fVar6;
  float64 fVar7;
  long lVar8;
  ulong uVar9;
  wr_t wx;
  wr_t *local_38;
  
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_38 = pwd;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar3 = float32_unordered_mips64el(pws->w[lVar8],pwt->w[lVar8],pfVar2);
      }
      else {
        iVar3 = float32_unordered_quiet_mips64el(pws->w[lVar8],pwt->w[lVar8],pfVar2);
      }
      uVar4 = -(uint)(iVar3 != 0);
      *(uint *)((long)&wx + lVar8 * 4) = uVar4;
      uVar5 = update_msacsr(env,2,0);
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
        fVar6 = float32_default_nan_mips64el(pfVar2);
        uVar4 = fVar6 & 0xffffffc0 ^ 0x400000 | uVar5;
        *(uint *)((long)&wx + lVar8 * 4) = uVar4;
      }
      if (uVar4 == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar3 = float32_le_mips64el(pws->w[lVar8],pwt->w[lVar8],pfVar2);
        }
        else {
          iVar3 = float32_le_quiet_mips64el(pws->w[lVar8],pwt->w[lVar8],pfVar2);
        }
        *(uint *)((long)&wx + lVar8 * 4) = -(uint)(iVar3 != 0);
        uVar4 = update_msacsr(env,2,0);
        if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
          fVar6 = float32_default_nan_mips64el(pfVar2);
          *(float32 *)((long)&wx + lVar8 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar4;
        }
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1763,
                    "void compare_ule(CPUMIPSState *, wr_t *, wr_t *, wr_t *, uint32_t, int, uintptr_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar3 = float64_unordered_mips64el(pws->d[lVar8],pwt->d[lVar8],pfVar2);
      }
      else {
        iVar3 = float64_unordered_quiet_mips64el(pws->d[lVar8],pwt->d[lVar8],pfVar2);
      }
      uVar9 = -(ulong)(iVar3 != 0);
      *(ulong *)((long)&wx + lVar8 * 8) = uVar9;
      uVar4 = update_msacsr(env,2,0);
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
        fVar7 = float64_default_nan_mips64el(pfVar2);
        uVar9 = (long)(int)uVar4 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
        *(ulong *)((long)&wx + lVar8 * 8) = uVar9;
      }
      if (uVar9 == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar3 = float64_le_mips64el(pws->d[lVar8],pwt->d[lVar8],pfVar2);
        }
        else {
          iVar3 = float64_le_quiet_mips64el(pws->d[lVar8],pwt->d[lVar8],pfVar2);
        }
        *(ulong *)((long)&wx + lVar8 * 8) = -(ulong)(iVar3 != 0);
        uVar4 = update_msacsr(env,2,0);
        if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
          fVar7 = float64_default_nan_mips64el(pfVar2);
          *(float64 *)((long)&wx + lVar8 * 8) =
               (long)(int)uVar4 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
        }
      }
    }
  }
  check_msacsr_cause(env,retaddr);
  local_38->d[0] = wx.d[0];
  local_38->d[1] = wx.d[1];
  return;
}

Assistant:

static inline void compare_ule(CPUMIPSState *env, wr_t *pwd, wr_t *pws,
                               wr_t *pwt, uint32_t df, int quiet,
                               uintptr_t retaddr)
{
    wr_t wx, *pwx = &wx;
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_ULE(pwx->w[i], pws->w[i], pwt->w[i], 32, quiet);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_ULE(pwx->d[i], pws->d[i], pwt->d[i], 64, quiet);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, retaddr);

    msa_move_v(pwd, pwx);
}